

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vga_ManAddClausesOne(Vta_Man_t *p,int iObj,int iFrame)

{
  uint uVar1;
  ulong uVar2;
  uint Entry;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Vta_Obj_t *pVVar7;
  undefined4 extraout_var;
  undefined8 in_RCX;
  uint *end;
  uint uVar8;
  sat_solver2 *s;
  int in_R8D;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  sat_solver2 *local_40;
  undefined8 local_38;
  
  pGVar6 = Gia_ManObj(p->pGia,iObj);
  pVVar7 = Vga_ManFindOrAdd(p,iObj,iFrame);
  Entry = Vta_ObjId(p,pVVar7);
  if ((pVVar7->iObj != iObj) || (pVVar7->iFrame != iFrame)) {
    __assert_fail("pThis->iObj == iObj && pThis->iFrame == iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                  ,0x4ec,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
  }
  if ((*(uint *)&pVVar7->field_0xc >> 0x1e & 1) == 0) {
    *(uint *)&pVVar7->field_0xc = *(uint *)&pVVar7->field_0xc | 0x40000000;
    Vec_IntPush(p->vAddedNew,Entry);
    uVar5 = *(uint *)pGVar6;
    iVar4 = (int)CONCAT71((int7)((ulong)in_RCX >> 8),(int)uVar5 < 0);
    if ((~uVar5 & 0x1fffffff) == 0 || (int)uVar5 < 0) {
      iVar3 = Gia_ObjIsRo(p->pGia,pGVar6);
      if (iVar3 == 0) {
        iVar4 = 0x1fffffff;
        if ((~*(ulong *)pGVar6 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absVta.c"
                        ,0x513,"void Vga_ManAddClausesOne(Vta_Man_t *, int, int)");
        }
LAB_005011c4:
        sat_solver2_add_const(p->pSat,Entry,Entry,iVar4,in_R8D);
        return;
      }
      if (iFrame == 0) {
        if (p->pPars->fUseTermVars == 0) goto LAB_005011c4;
        pVVar7 = Vga_ManFindOrAdd(p,iObj,-1);
        s = p->pSat;
        iVar4 = Vta_ObjId(p,pVVar7);
        if ((int)Entry < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0x166,
                        "int sat_solver2_add_constraint(sat_solver2 *, int, int, int, int, int)");
        }
        uVar5 = Entry * 2 + 1;
        end = &local_48;
        local_4c = iVar4 * 2;
        local_50 = uVar5;
        sat_solver2_addclause(s,(lit *)&local_50,(lit *)end,Entry);
        local_4c = iVar4 * 2 + 1;
        local_50 = uVar5;
      }
      else {
        pGVar6 = Gia_ObjRoToRi(p->pGia,pGVar6);
        iVar4 = Gia_ObjFaninId0p(p->pGia,pGVar6);
        pVVar7 = Vga_ManFindOrAdd(p,iVar4,iFrame + -1);
        s = p->pSat;
        uVar5 = Vta_ObjId(p,pVVar7);
        if ((int)(uVar5 | Entry) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)")
          ;
        }
        local_50 = Entry * 2;
        end = &local_48;
        uVar5 = ((uint)(*(ulong *)pGVar6 >> 0x1d) & 1) + uVar5 * 2;
        local_4c = uVar5 ^ 1;
        sat_solver2_addclause(s,(lit *)&local_50,(lit *)end,Entry);
        local_50 = Entry * 2 + 1;
        local_4c = uVar5;
      }
    }
    else {
      iVar4 = Gia_ObjFaninId0p(p->pGia,pGVar6);
      pVVar7 = Vga_ManFindOrAdd(p,iVar4,iFrame);
      iVar4 = Vta_ObjId(p,pVVar7);
      iVar3 = Gia_ObjFaninId1p(p->pGia,pGVar6);
      pVVar7 = Vga_ManFindOrAdd(p,iVar3,iFrame);
      local_40 = p->pSat;
      iVar3 = Vta_ObjId(p,pVVar7);
      s = local_40;
      local_38 = CONCAT44(extraout_var,iVar3);
      uVar2 = *(ulong *)pGVar6;
      local_44 = Entry * 2;
      uVar1 = Entry * 2 + 1;
      uVar5 = ((uint)(uVar2 >> 0x1d) & 1) + iVar4 * 2;
      local_50 = uVar1;
      local_4c = uVar5;
      sat_solver2_addclause(local_40,(lit *)&local_50,(lit *)&local_48,Entry);
      uVar8 = ((uint)(uVar2 >> 0x3d) & 1) + (int)local_38 * 2;
      local_50 = uVar1;
      local_4c = uVar8;
      sat_solver2_addclause(s,(lit *)&local_50,(lit *)&local_48,Entry);
      local_50 = local_44;
      local_4c = uVar5 ^ 1;
      local_48 = uVar8 ^ 1;
      end = &local_44;
    }
    sat_solver2_addclause(s,(lit *)&local_50,(lit *)end,Entry);
  }
  return;
}

Assistant:

void Vga_ManAddClausesOne( Vta_Man_t * p, int iObj, int iFrame )
{ 
    Vta_Obj_t * pThis0, * pThis1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
    Vta_Obj_t * pThis = Vga_ManFindOrAdd( p, iObj, iFrame );
    int iThis0, iMainVar = Vta_ObjId(p, pThis);
    assert( pThis->iObj == iObj && pThis->iFrame == iFrame );
    if ( pThis->fAdded )
        return;
    pThis->fAdded = 1;
    Vec_IntPush( p->vAddedNew, iMainVar );
    if ( Gia_ObjIsAnd(pObj) )
    {
        pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame );
        iThis0 = Vta_ObjId(p, pThis0);
        pThis1 = Vga_ManFindOrAdd( p, Gia_ObjFaninId1p(p->pGia, pObj), iFrame );
        sat_solver2_add_and( p->pSat, iMainVar, iThis0, Vta_ObjId(p, pThis1), 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0, iMainVar );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( iFrame == 0 )
        {
            if ( p->pPars->fUseTermVars )
            {
                pThis0 = Vga_ManFindOrAdd( p, iObj, -1 );
                sat_solver2_add_constraint( p->pSat, iMainVar, Vta_ObjId(p, pThis0), 1, 0, iMainVar );
            }
            else
            {
                sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
            }
        }
        else
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            pThis0 = Vga_ManFindOrAdd( p, Gia_ObjFaninId0p(p->pGia, pObj), iFrame-1 );
            sat_solver2_add_buffer( p->pSat, iMainVar, Vta_ObjId(p, pThis0), Gia_ObjFaninC0(pObj), 0, iMainVar );  
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        sat_solver2_add_const( p->pSat, iMainVar, 1, 0, iMainVar );
    }
    else //if ( !Gia_ObjIsPi(p->pGia, pObj) )
        assert( 0 );
}